

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void PARMCI_Memget(size_t bytes,armci_meminfo_t *meminfo,int memflg)

{
  void *pvVar1;
  int in_EDX;
  undefined8 *in_RSI;
  char *in_RDI;
  int rank;
  size_t size;
  void *armci_ptr;
  void *myptr;
  int in_stack_ffffffffffffffcc;
  void *pvVar2;
  
  comex_group_rank(0,(int *)0x0);
  if (in_RDI == (char *)0x0) {
    comex_error((char *)0x0,in_stack_ffffffffffffffcc);
  }
  if (in_RSI == (undefined8 *)0x0) {
    comex_error(in_RDI,in_stack_ffffffffffffffcc);
  }
  if (in_EDX != 0) {
    comex_error(in_RDI,in_stack_ffffffffffffffcc);
  }
  pvVar1 = comex_malloc_local((size_t)in_RDI);
  pvVar2 = pvVar1;
  if ((in_RDI != (char *)0x0) && (pvVar1 == (void *)0x0)) {
    comex_error(in_RDI,in_stack_ffffffffffffffcc);
  }
  *in_RSI = pvVar1;
  in_RSI[1] = pvVar2;
  in_RSI[2] = in_RDI;
  *(int *)(in_RSI + 3) = in_stack_ffffffffffffffcc;
  return;
}

Assistant:

void PARMCI_Memget(size_t bytes, armci_meminfo_t *meminfo, int memflg)
{
    void *myptr=NULL;
    void *armci_ptr=NULL; /* legal ARCMI ptr used in ARMCI data xfer ops*/
    size_t size = bytes;
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(size<=0) comex_error("PARMCI_Memget: size must be > 0", (int)size);
    if(meminfo==NULL) comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);
    if(memflg!=0) comex_error("PARMCI_Memget: Invalid memflg", memflg);

    armci_ptr = myptr = comex_malloc_local(size);
    if(size) if(!myptr) comex_error("PARMCI_Memget failed", (int)size);

    /* fill the meminfo structure */
    meminfo->armci_addr = armci_ptr;
    meminfo->addr       = myptr;
    meminfo->size       = size;
    meminfo->cpid       = rank;
    /* meminfo->attr       = NULL; */
}